

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteGroupMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  undefined4 extraout_var;
  byte *pbVar4;
  uint8 *puVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar5;
  }
  pbVar3 = output->cur_;
  bVar6 = (byte)uVar9;
  if (uVar9 < 0x80) {
    *pbVar3 = bVar6 | 3;
    pbVar3 = pbVar3 + 1;
  }
  else {
    *pbVar3 = bVar6 | 0x83;
    if (uVar9 < 0x4000) {
      pbVar3[1] = (byte)(uVar9 >> 7);
      pbVar3 = pbVar3 + 2;
    }
    else {
      pbVar3 = pbVar3 + 2;
      uVar8 = uVar9 >> 7;
      do {
        pbVar4 = pbVar3;
        pbVar4[-1] = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar3 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar1);
      *pbVar4 = (byte)uVar7;
    }
  }
  output->cur_ = pbVar3;
  (*value->_vptr_MessageLite[0xc])(value);
  iVar2 = (*value->_vptr_MessageLite[0xe])(value,output->cur_,output);
  puVar5 = (uint8 *)CONCAT44(extraout_var,iVar2);
  output->cur_ = puVar5;
  if ((output->impl_).end_ <= puVar5) {
    puVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,puVar5);
    output->cur_ = puVar5;
  }
  pbVar3 = output->cur_;
  if (uVar9 < 0x80) {
    *pbVar3 = bVar6 | 4;
    pbVar3 = pbVar3 + 1;
  }
  else {
    *pbVar3 = bVar6 | 0x84;
    if (uVar9 < 0x4000) {
      pbVar3[1] = (byte)(uVar9 >> 7);
      pbVar3 = pbVar3 + 2;
    }
    else {
      pbVar3 = pbVar3 + 2;
      uVar9 = uVar9 >> 7;
      do {
        pbVar4 = pbVar3;
        pbVar4[-1] = (byte)uVar9 | 0x80;
        uVar8 = uVar9 >> 7;
        pbVar3 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar9;
        uVar9 = uVar8;
      } while (bVar1);
      *pbVar4 = (byte)uVar8;
    }
  }
  output->cur_ = pbVar3;
  return;
}

Assistant:

void WireFormatLite::WriteGroupMaybeToArray(int field_number,
                                            const MessageLite& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_START_GROUP, output);
  const int size = value.GetCachedSize();
  WriteSubMessageMaybeToArray(size, value, output);
  WriteTag(field_number, WIRETYPE_END_GROUP, output);
}